

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

void __thiscall BigInteger::BigInteger(BigInteger *this,string *s)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  invalid_number_error *this_00;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar3 = (byte *)(s->_M_dataplus)._M_p;
  pbVar6 = pbVar3 + s->_M_string_length;
  do {
    temp = 0;
    iVar5 = 1;
    pbVar7 = pbVar6;
    uVar4 = 0;
    do {
      do {
        while( true ) {
          pbVar6 = pbVar7 + -1;
          if (pbVar7 == pbVar3) {
            bVar2 = std::operator==(s,"-");
            if (bVar2) {
              temp = 1;
            }
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->digits,&temp)
            ;
            normalize(this);
            return;
          }
          bVar1 = *pbVar6;
          pbVar7 = pbVar6;
          if (bVar1 != 0x2d) break;
          this->negative = true;
        }
      } while (bVar1 == 0x2b);
      if ((byte)(bVar1 - 0x3a) < 0xf6) {
        this_00 = (invalid_number_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_48,"Invalid integer: ",s);
        invalid_number_error::runtime_error(this_00,&local_48);
        __cxa_throw(this_00,&invalid_number_error::typeinfo,std::runtime_error::~runtime_error);
      }
      temp = uVar4 + (bVar1 - 0x30) * iVar5;
      iVar5 = iVar5 * 10;
      uVar4 = temp;
    } while (iVar5 != 1000000000);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->digits,&temp);
    pbVar3 = (byte *)(s->_M_dataplus)._M_p;
  } while( true );
}

Assistant:

BigInteger::BigInteger(const std::string &s): digits(), negative(false)
{
    unsigned temp = 0;
    unsigned pow = 1;
    for(auto i = s.crbegin(); i != s.crend(); ++i)
    {
        if(*i == '-' || *i == '+')
        {
            if(*i == '-')
                negative = true;
            continue;
        }
        if(*i < '0' || *i > '9')
            throw invalid_number_error("Invalid integer: " + s);
        temp += pow * (*i - '0');
        pow *= 10;
        if(pow == BLOCK_MOD)
        {
            pow = 1;
            digits.push_back(temp);
            temp = 0;
        }
    }
    if(s == "-")
        temp = 1;
    digits.push_back(temp);
    normalize();
}